

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O1

void test_andnot(_Bool copy_on_write)

{
  _Bool _Var1;
  roaring_bitmap_t *prVar2;
  roaring_bitmap_t *prVar3;
  roaring_bitmap_t *prVar4;
  roaring_bitmap_t *x2;
  roaring_bitmap_t *x2_00;
  roaring_bitmap_t *r1;
  roaring_bitmap_t *r1_00;
  roaring_bitmap_t *r1_01;
  roaring_bitmap_t *r1_02;
  roaring_bitmap_t *r1_03;
  roaring_bitmap_t *prVar5;
  roaring_bitmap_t *r2;
  roaring_bitmap_t *r1_04;
  uint64_t a;
  long lVar6;
  int i_1;
  ulong uVar7;
  roaring_bitmap_t **pprVar8;
  roaring_bitmap_t **pprVar9;
  char *__format;
  int iVar10;
  uint32_t i;
  uint32_t uVar11;
  roaring_bitmap_t *r [10];
  int d3_minus_d2 [2];
  roaring_bitmap_t *local_88 [5];
  roaring_bitmap_t *local_60;
  roaring_bitmap_t *local_58;
  roaring_bitmap_t *local_50;
  roaring_bitmap_t *local_48;
  undefined8 local_40;
  int local_38 [2];
  
  uVar7 = 0;
  prVar2 = roaring_bitmap_create_with_capacity(0);
  (prVar2->high_low_container).flags = (prVar2->high_low_container).flags & 0xfe | copy_on_write;
  prVar3 = roaring_bitmap_create_with_capacity(0);
  (prVar3->high_low_container).flags = (prVar3->high_low_container).flags & 0xfe | copy_on_write;
  prVar4 = roaring_from_sentinel_array((int *)&DAT_001351b0,copy_on_write);
  x2 = roaring_from_sentinel_array((int *)&DAT_001351f0,copy_on_write);
  x2_00 = roaring_from_sentinel_array((int *)&DAT_00135220,copy_on_write);
  r1 = roaring_from_sentinel_array((int *)&DAT_00135250,copy_on_write);
  r1_00 = roaring_from_sentinel_array((int *)&DAT_00135280,copy_on_write);
  r1_01 = roaring_from_sentinel_array((int *)&DAT_00138400,copy_on_write);
  r1_02 = roaring_from_sentinel_array((int *)&DAT_001352b0,copy_on_write);
  local_38[0] = 0xa0001;
  local_38[1] = -1;
  r1_03 = roaring_from_sentinel_array(local_38,copy_on_write);
  prVar5 = roaring_bitmap_andnot(prVar4,x2);
  _Var1 = roaring_bitmap_equals(r1,prVar5);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(rb1_minus_rb2, temp)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x914);
  roaring_bitmap_free(prVar5);
  prVar5 = roaring_bitmap_andnot(prVar4,x2_00);
  _Var1 = roaring_bitmap_equals(r1_00,prVar5);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(rb1_minus_rb3, temp)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x918);
  roaring_bitmap_free(prVar5);
  prVar5 = roaring_bitmap_andnot(x2,prVar4);
  _Var1 = roaring_bitmap_equals(r1_01,prVar5);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(rb2_minus_rb1, temp)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x91c);
  roaring_bitmap_free(prVar5);
  prVar5 = roaring_bitmap_andnot(x2_00,prVar4);
  _Var1 = roaring_bitmap_equals(r1_02,prVar5);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(rb3_minus_rb1, temp)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x920);
  roaring_bitmap_free(prVar5);
  prVar5 = roaring_bitmap_andnot(x2_00,x2);
  _Var1 = roaring_bitmap_equals(r1_03,prVar5);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(rb3_minus_rb2, temp)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x924);
  roaring_bitmap_free(prVar5);
  prVar5 = roaring_bitmap_from_range(2,0xb001b,1);
  r2 = roaring_bitmap_andnot(prVar4,prVar5);
  r1_04 = roaring_from_sentinel_array((int *)&DAT_001352d0,copy_on_write);
  _Var1 = roaring_bitmap_equals(r1_04,r2);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(rb1_minus_largerun, temp)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x92f);
  roaring_bitmap_free(r2);
  roaring_bitmap_free(prVar4);
  roaring_bitmap_free(x2);
  roaring_bitmap_free(x2_00);
  roaring_bitmap_free(r1);
  roaring_bitmap_free(r1_00);
  roaring_bitmap_free(r1_01);
  roaring_bitmap_free(r1_02);
  roaring_bitmap_free(r1_03);
  roaring_bitmap_free(r1_04);
  roaring_bitmap_free(prVar5);
  do {
    uVar11 = (uint32_t)uVar7;
    if ((uVar7 & 1) == 0) {
      roaring_bitmap_add(prVar2,uVar11);
    }
    if ((int)(uVar7 / 3) * 3 == uVar11) {
      roaring_bitmap_add(prVar3,uVar11);
    }
    uVar7 = (ulong)(uVar11 + 1);
  } while (uVar11 + 1 != 300);
  prVar4 = roaring_bitmap_andnot(prVar2,prVar3);
  (prVar4->high_low_container).flags = ((prVar4->high_low_container).flags & 0xfe) + copy_on_write;
  iVar10 = 0;
  uVar7 = 0;
  do {
    uVar11 = (uint32_t)uVar7;
    if (((uVar7 & 1) == 0) && ((int)(uVar7 / 3) * 3 != uVar11)) {
      iVar10 = iVar10 + 1;
      _Var1 = roaring_bitmap_contains(prVar4,uVar11);
      __format = "missing %d\n";
      if (!_Var1) {
LAB_00106ec4:
        printf(__format,uVar7);
      }
    }
    else {
      _Var1 = roaring_bitmap_contains(prVar4,uVar11);
      __format = "surplus %d\n";
      if (_Var1) goto LAB_00106ec4;
    }
    uVar7 = (ulong)(uVar11 + 1);
    if (uVar11 + 1 == 300) {
      a = roaring_bitmap_get_cardinality(prVar4);
      _assert_int_equal(a,(long)iVar10,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                        ,0x94f);
      roaring_bitmap_free(prVar4);
      roaring_bitmap_free(prVar3);
      roaring_bitmap_free(prVar2);
      local_88[0] = gen_bitmap(0.0,1e-06,1,0,0,1000000);
      local_88[1] = gen_bitmap(1.0,-1e-06,1,0,0,1000000);
      local_88[2] = gen_bitmap(1e-05,0.0,1,0,0,2000000);
      local_88[3] = gen_bitmap(1e-05,0.0,3,0,0,2000000);
      local_88[4] = gen_bitmap(0.1,0.0,1,0,0,2000000);
      local_60 = gen_bitmap(0.001,1e-07,1,0,0,1000000);
      local_58 = gen_bitmap(0.0,1e-10,1,0,0,1000000);
      local_50 = gen_bitmap(0.5,-1e-06,1,600000,800000,1000000);
      local_48 = gen_bitmap(1.0,-1e-06,1,300000,500000,1000000);
      local_40 = 0;
      if (local_88[0] != (roaring_bitmap_t *)0x0) {
        pprVar8 = local_88;
        lVar6 = 0;
        prVar2 = local_88[0];
        do {
          pprVar8 = pprVar8 + 1;
          prVar3 = local_88[lVar6];
          pprVar9 = pprVar8;
          while (prVar3 != (roaring_bitmap_t *)0x0) {
            prVar4 = synthesized_andnot(prVar2,prVar3);
            prVar3 = roaring_bitmap_andnot(prVar2,prVar3);
            _Var1 = roaring_bitmap_equals(prVar4,prVar3);
            _assert_true((ulong)_Var1,"is_equal",
                         "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                         ,0x973);
            roaring_bitmap_free(prVar4);
            roaring_bitmap_free(prVar3);
            prVar3 = *pprVar9;
            pprVar9 = pprVar9 + 1;
          }
          prVar2 = local_88[lVar6 + 1];
          lVar6 = lVar6 + 1;
        } while (prVar2 != (roaring_bitmap_t *)0x0);
      }
      if (local_88[0] != (roaring_bitmap_t *)0x0) {
        pprVar8 = local_88;
        prVar2 = local_88[0];
        do {
          pprVar8 = pprVar8 + 1;
          roaring_bitmap_free(prVar2);
          prVar2 = *pprVar8;
        } while (prVar2 != (roaring_bitmap_t *)0x0);
      }
      return;
    }
  } while( true );
}

Assistant:

void test_andnot(bool copy_on_write) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r1, copy_on_write);
    roaring_bitmap_t *r2 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r2, copy_on_write);

    int data1[] = {1,
                   2,
                   65536 * 2 + 1,
                   65536 * 2 + 2,
                   65536 * 3 + 1,
                   65536 * 3 + 2,
                   65536 * 10 + 1,
                   65536 * 10 + 2,
                   65536 * 16 + 1,
                   65536 * 16 + 2,
                   65536 * 20 + 1,
                   65536 * 21 + 1,
                   -1};
    roaring_bitmap_t *rb1 = roaring_from_sentinel_array(data1, copy_on_write);
    int data2[] = {2,
                   3,
                   65536 * 10 + 2,
                   65536 * 10 + 3,
                   65536 * 12 + 2,
                   65536 * 12 + 3,
                   65536 * 14 + 2,
                   65536 * 14 + 3,
                   65536 * 16 + 2,
                   65536 * 16 + 3,
                   -1};
    roaring_bitmap_t *rb2 = roaring_from_sentinel_array(data2, copy_on_write);

    int data3[] = {2,
                   3,
                   65536 * 10 + 1,
                   65536 * 10 + 2,
                   65536 * 12 + 2,
                   65536 * 12 + 3,
                   65536 * 14 + 2,
                   65536 * 14 + 3,
                   65536 * 16 + 2,
                   65536 * 16 + 3,
                   -1};
    roaring_bitmap_t *rb3 = roaring_from_sentinel_array(data3, copy_on_write);
    int d1_minus_d2[] = {1,
                         65536 * 2 + 1,
                         65536 * 2 + 2,
                         65536 * 3 + 1,
                         65536 * 3 + 2,
                         65536 * 10 + 1,
                         65536 * 16 + 1,
                         65536 * 20 + 1,
                         65536 * 21 + 1,
                         -1};
    roaring_bitmap_t *rb1_minus_rb2 =
        roaring_from_sentinel_array(d1_minus_d2, copy_on_write);

    int d1_minus_d3[] = {1, 65536 * 2 + 1, 65536 * 2 + 2, 65536 * 3 + 1,
                         65536 * 3 + 2,
                         // 65536*10+1,
                         65536 * 16 + 1, 65536 * 20 + 1, 65536 * 21 + 1, -1};
    roaring_bitmap_t *rb1_minus_rb3 =
        roaring_from_sentinel_array(d1_minus_d3, copy_on_write);

    int d2_minus_d1[] = {3,
                         65536 * 10 + 3,
                         65536 * 12 + 2,
                         65536 * 12 + 3,
                         65536 * 14 + 2,
                         65536 * 14 + 3,
                         65536 * 16 + 3,
                         -1};

    roaring_bitmap_t *rb2_minus_rb1 =
        roaring_from_sentinel_array(d2_minus_d1, copy_on_write);

    int d3_minus_d1[] = {3,
                         // 65536*10+3,
                         65536 * 12 + 2, 65536 * 12 + 3, 65536 * 14 + 2,
                         65536 * 14 + 3, 65536 * 16 + 3, -1};
    roaring_bitmap_t *rb3_minus_rb1 =
        roaring_from_sentinel_array(d3_minus_d1, copy_on_write);

    int d3_minus_d2[] = {65536 * 10 + 1, -1};
    roaring_bitmap_t *rb3_minus_rb2 =
        roaring_from_sentinel_array(d3_minus_d2, copy_on_write);

    roaring_bitmap_t *temp = roaring_bitmap_andnot(rb1, rb2);
    assert_true(roaring_bitmap_equals(rb1_minus_rb2, temp));
    roaring_bitmap_free(temp);

    temp = roaring_bitmap_andnot(rb1, rb3);
    assert_true(roaring_bitmap_equals(rb1_minus_rb3, temp));
    roaring_bitmap_free(temp);

    temp = roaring_bitmap_andnot(rb2, rb1);
    assert_true(roaring_bitmap_equals(rb2_minus_rb1, temp));
    roaring_bitmap_free(temp);

    temp = roaring_bitmap_andnot(rb3, rb1);
    assert_true(roaring_bitmap_equals(rb3_minus_rb1, temp));
    roaring_bitmap_free(temp);

    temp = roaring_bitmap_andnot(rb3, rb2);
    assert_true(roaring_bitmap_equals(rb3_minus_rb2, temp));
    roaring_bitmap_free(temp);

    roaring_bitmap_t *large_run_bitmap =
        roaring_bitmap_from_range(2, 11 * 65536 + 27, 1);
    temp = roaring_bitmap_andnot(rb1, large_run_bitmap);

    int d1_minus_largerun[] = {
        1, 65536 * 16 + 1, 65536 * 16 + 2, 65536 * 20 + 1, 65536 * 21 + 1, -1};
    roaring_bitmap_t *rb1_minus_largerun =
        roaring_from_sentinel_array(d1_minus_largerun, copy_on_write);
    assert_true(roaring_bitmap_equals(rb1_minus_largerun, temp));
    roaring_bitmap_free(temp);

    roaring_bitmap_free(rb1);
    roaring_bitmap_free(rb2);
    roaring_bitmap_free(rb3);
    roaring_bitmap_free(rb1_minus_rb2);
    roaring_bitmap_free(rb1_minus_rb3);
    roaring_bitmap_free(rb2_minus_rb1);
    roaring_bitmap_free(rb3_minus_rb1);
    roaring_bitmap_free(rb3_minus_rb2);
    roaring_bitmap_free(rb1_minus_largerun);
    roaring_bitmap_free(large_run_bitmap);

    for (uint32_t i = 0; i < 300; ++i) {
        if (i % 2 == 0) roaring_bitmap_add(r1, i);
        if (i % 3 == 0) roaring_bitmap_add(r2, i);
    }

    roaring_bitmap_t *r1_andnot_r2 = roaring_bitmap_andnot(r1, r2);
    roaring_bitmap_set_copy_on_write(r1_andnot_r2, copy_on_write);

    int ansctr = 0;
    for (int i = 0; i < 300; ++i) {
        if ((i % 2 == 0) && (i % 3 != 0)) {
            ansctr++;
            if (!roaring_bitmap_contains(r1_andnot_r2, i))
                printf("missing %d\n", i);
        } else if (roaring_bitmap_contains(r1_andnot_r2, i))
            printf("surplus %d\n", i);
    }

    assert_int_equal(roaring_bitmap_get_cardinality(r1_andnot_r2), ansctr);
    roaring_bitmap_free(r1_andnot_r2);
    roaring_bitmap_free(r2);
    roaring_bitmap_free(r1);

    // some tougher tests on synthetic data

    roaring_bitmap_t *r[] = {
        // ascending density, last containers might be runs
        gen_bitmap(0.0, 1e-6, 1, 0, 0, 1000000),
        // descending density, first containers might be runs
        gen_bitmap(1.0, -1e-6, 1, 0, 0, 1000000),
        // uniformly rather sparse
        gen_bitmap(1e-5, 0.0, 1, 0, 0, 2000000),
        // uniformly rather sparse with runs
        gen_bitmap(1e-5, 0.0, 3, 0, 0, 2000000),
        // uniformly rather dense
        gen_bitmap(1e-1, 0.0, 1, 0, 0, 2000000),
        // ascending density but never too dense
        gen_bitmap(0.001, 1e-7, 1, 0, 0, 1000000),
        // ascending density but very sparse
        gen_bitmap(0.0, 1e-10, 1, 0, 0, 1000000),
        // descending with a gap
        gen_bitmap(0.5, -1e-6, 1, 600000, 800000, 1000000),
        //  gap elsewhere
        gen_bitmap(1, -1e-6, 1, 300000, 500000, 1000000),
        0  // sentinel
    };

    for (int i = 0; r[i]; ++i) {
        for (int j = i; r[j]; ++j) {
            roaring_bitmap_t *expected = synthesized_andnot(r[i], r[j]);
            roaring_bitmap_t *result = roaring_bitmap_andnot(r[i], r[j]);

            bool is_equal = roaring_bitmap_equals(expected, result);

            assert_true(is_equal);
            roaring_bitmap_free(expected);
            roaring_bitmap_free(result);
        }
    }
    for (int i = 0; r[i]; ++i) roaring_bitmap_free(r[i]);
}